

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O2

bool cmCMakePolicyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  cmState *this;
  cmValue cVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  PolicyID id;
  PolicyID id_00;
  size_t sVar10;
  string *psVar11;
  cmMakefile *pcVar12;
  pointer pbVar13;
  string_view value;
  string_view value_00;
  undefined1 local_f8 [32];
  _WordT local_d8;
  _WordT _Stack_d0;
  _WordT local_c8;
  string version_min;
  cmAlphaNum local_98;
  string version_max;
  PolicyID pid;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"requires at least one argument.",(allocator<char> *)&local_98);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    bVar2 = std::operator==(__lhs,"SET");
    if (bVar2) {
      pbVar13 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 == 0x60) {
        bVar2 = std::operator==(pbVar13 + 2,"OLD");
        PVar5 = OLD;
        if (!bVar2) {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2,"NEW");
          if (!bVar3) {
            local_f8._0_8_ = (char *)0x26;
            local_f8._8_8_ = "SET given unrecognized policy status \"";
            pbVar13 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_98.View_._M_str = pbVar13[2]._M_dataplus._M_p;
            local_98.View_._M_len = pbVar13[2]._M_string_length;
            cmStrCat<char[2]>(&version_min,(cmAlphaNum *)local_f8,&local_98,(char (*) [2])0x6735bd);
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00204e0a:
            psVar11 = &version_min;
            goto LAB_00204d46;
          }
          PVar5 = NEW;
        }
        bVar3 = cmMakefile::SetPolicy
                          (status->Makefile,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,PVar5);
        if (bVar3) {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1,"CMP0001");
          bVar4 = true;
          if (!bVar2 || !bVar3) {
            return true;
          }
          this = cmMakefile::GetState(status->Makefile);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_f8,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&local_98
                    );
          cVar6 = cmState::GetInitializedCacheValue(this,(string *)local_f8);
          std::__cxx11::string::~string((string *)local_f8);
          if (cVar6.Value != (string *)0x0) {
            return true;
          }
          pcVar12 = status->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_f8,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&local_98
                    );
          cmMakefile::AddCacheDefinition
                    (pcVar12,(string *)local_f8,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
LAB_00204ab2:
          psVar11 = (string *)local_f8;
          goto LAB_00204db2;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,"SET failed to set policy.",(allocator<char> *)&local_98);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,"SET must be given exactly 2 additional arguments.",
                   (allocator<char> *)&local_98);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,"GET");
      if (bVar2) {
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13;
        if (lVar7 == 0x80) {
          bVar2 = std::operator==(pbVar13 + 3,"PARENT_SCOPE");
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          bVar3 = true;
          if (!bVar2) {
            lVar7 = (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13;
            goto LAB_00204b35;
          }
        }
        else {
LAB_00204b35:
          if (lVar7 != 0x60) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_f8,"GET must be given exactly 2 additional arguments.",
                       (allocator<char> *)&local_98);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00204d41;
          }
          bVar3 = false;
        }
        bVar4 = cmPolicies::GetPolicyID(pbVar13[1]._M_dataplus._M_p,&pid);
        if (bVar4) {
          PVar5 = cmMakefile::GetPolicyStatus(status->Makefile,pid,bVar3);
          if (REQUIRED_ALWAYS < PVar5) {
            return bVar4;
          }
          switch(PVar5) {
          case OLD:
            pcVar12 = status->Makefile;
            pcVar9 = "OLD";
            break;
          case WARN:
            pcVar12 = status->Makefile;
            pcVar9 = "";
            sVar10 = 0;
            goto LAB_00205068;
          case NEW:
            pcVar12 = status->Makefile;
            pcVar9 = "NEW";
            break;
          default:
            pcVar12 = status->Makefile;
            cmPolicies::GetRequiredPolicyError_abi_cxx11_(&version_max,(cmPolicies *)(ulong)pid,id);
            local_f8._0_8_ = version_max._M_string_length;
            local_f8._8_8_ = version_max._M_dataplus._M_p;
            local_98.View_._M_len = 1;
            local_98.View_._M_str = "\n";
            cmStrCat<char[30],std::__cxx11::string,char[82],char[61]>
                      (&version_min,(cmAlphaNum *)local_f8,&local_98,
                       (char (*) [30])"The call to cmake_policy(GET ",pbVar13 + 1,
                       (char (*) [82])
                       " ...) at which this error appears requests the policy, and this version of CMake "
                       ,(char (*) [61])
                        "requires that the policy be set to NEW before it is checked.");
            cmMakefile::IssueMessage(pcVar12,FATAL_ERROR,&version_min);
            std::__cxx11::string::~string((string *)&version_min);
            psVar11 = &version_max;
            goto LAB_00204db2;
          }
          sVar10 = 3;
LAB_00205068:
          value_00._M_str = pcVar9;
          value_00._M_len = sVar10;
          cmMakefile::AddDefinition(pcVar12,pbVar13 + 2,value_00);
          return bVar4;
        }
        local_f8._0_8_ = (char *)0x12;
        local_f8._8_8_ = "GET given policy \"";
        local_98.View_._M_str = pbVar13[1]._M_dataplus._M_p;
        local_98.View_._M_len = pbVar13[1]._M_string_length;
        cmStrCat<char[47]>(&version_min,(cmAlphaNum *)local_f8,&local_98,
                           (char (*) [47])"\" which is not known to this version of CMake.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00204dad:
        psVar11 = &version_min;
LAB_00204db2:
        std::__cxx11::string::~string((string *)psVar11);
        return bVar4;
      }
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,"PUSH");
      if (bVar2) {
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          local_d8 = 0;
          _Stack_d0 = 0;
          local_f8._16_8_ = 0;
          local_f8._24_8_ = 0;
          local_f8._0_8_ = (pointer)0x0;
          local_f8._8_8_ = (char *)0x0;
          local_c8 = 0;
          cmMakefile::PushPolicy(status->Makefile,false,(PolicyMap *)local_f8);
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,"PUSH may not be given additional arguments.",
                   (allocator<char> *)&local_98);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,"POP");
        if (!bVar2) {
          bVar2 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,"VERSION");
          if (bVar2) {
            pbVar13 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar8 = (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13;
            if (uVar8 < 0x21) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_f8,"VERSION not given an argument",
                         (allocator<char> *)&local_98);
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            else {
              if (uVar8 == 0x40) {
                pbVar1 = pbVar13 + 1;
                lVar7 = std::__cxx11::string::find((char *)pbVar1,0x67ea66);
                std::__cxx11::string::substr((ulong)&version_min,(ulong)pbVar1);
                if (lVar7 == -1) {
                  version_max._M_dataplus._M_p = (pointer)&version_max.field_2;
                  version_max._M_string_length = 0;
                  version_max.field_2._M_local_buf[0] = '\0';
LAB_00205131:
                  bVar4 = cmMakefile::SetPolicyVersion(status->Makefile,&version_min,&version_max);
                }
                else {
                  std::__cxx11::string::substr((ulong)&version_max,(ulong)pbVar1);
                  if ((version_min._M_string_length != 0) && (version_max._M_string_length != 0))
                  goto LAB_00205131;
                  local_f8._0_8_ = &DAT_00000009;
                  local_f8._8_8_ = "VERSION \"";
                  local_98.View_._M_str = pbVar13[1]._M_dataplus._M_p;
                  local_98.View_._M_len = pbVar13[1]._M_string_length;
                  cmStrCat<char[50]>((string *)&pid,(cmAlphaNum *)local_f8,&local_98,
                                     (char (*) [50])
                                     "\" does not have a version on both sides of \"...\".");
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  std::__cxx11::string::~string((string *)&pid);
                  bVar4 = false;
                }
                std::__cxx11::string::~string((string *)&version_max);
                goto LAB_00204dad;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_f8,"VERSION given too many arguments",
                         (allocator<char> *)&local_98);
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            goto LAB_00204d41;
          }
          bVar2 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,"GET_WARNING");
          if (!bVar2) {
            local_f8._0_8_ = &DAT_0000001e;
            local_f8._8_8_ = "given unknown first argument \"";
            pbVar13 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_98.View_._M_str = (pbVar13->_M_dataplus)._M_p;
            local_98.View_._M_len = pbVar13->_M_string_length;
            cmStrCat<char[2]>(&version_min,(cmAlphaNum *)local_f8,&local_98,(char (*) [2])0x6735bd);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00204e0a;
          }
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 != 0x60) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_f8,
                       "GET_WARNING must be given exactly 2 additional arguments.",
                       (allocator<char> *)&local_98);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00204d41;
          }
          bVar4 = cmPolicies::GetPolicyID(pbVar13[1]._M_dataplus._M_p,(PolicyID *)&version_max);
          if (bVar4) {
            pcVar12 = status->Makefile;
            cmPolicies::GetPolicyWarning_abi_cxx11_
                      ((string *)local_f8,
                       (cmPolicies *)((ulong)version_max._M_dataplus._M_p & 0xffffffff),id_00);
            value._M_str = (char *)local_f8._0_8_;
            value._M_len = local_f8._8_8_;
            cmMakefile::AddDefinition(pcVar12,pbVar13 + 2,value);
            goto LAB_00204ab2;
          }
          local_f8._0_8_ = &DAT_0000001a;
          local_f8._8_8_ = "GET_WARNING given policy \"";
          local_98.View_._M_str = pbVar13[1]._M_dataplus._M_p;
          local_98.View_._M_len = pbVar13[1]._M_string_length;
          cmStrCat<char[47]>(&version_min,(cmAlphaNum *)local_f8,&local_98,
                             (char (*) [47])"\" which is not known to this version of CMake.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00204dad;
        }
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          cmMakefile::PopPolicy(status->Makefile);
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,"POP may not be given additional arguments.",
                   (allocator<char> *)&local_98);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
  }
LAB_00204d41:
  psVar11 = (string *)local_f8;
LAB_00204d46:
  std::__cxx11::string::~string((string *)psVar11);
  return false;
}

Assistant:

bool cmCMakePolicyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("requires at least one argument.");
    return false;
  }

  if (args[0] == "SET") {
    return HandleSetMode(args, status);
  }
  if (args[0] == "GET") {
    return HandleGetMode(args, status);
  }
  if (args[0] == "PUSH") {
    if (args.size() > 1) {
      status.SetError("PUSH may not be given additional arguments.");
      return false;
    }
    status.GetMakefile().PushPolicy();
    return true;
  }
  if (args[0] == "POP") {
    if (args.size() > 1) {
      status.SetError("POP may not be given additional arguments.");
      return false;
    }
    status.GetMakefile().PopPolicy();
    return true;
  }
  if (args[0] == "VERSION") {
    return HandleVersionMode(args, status);
  }
  if (args[0] == "GET_WARNING") {
    return HandleGetWarningMode(args, status);
  }

  status.SetError(cmStrCat("given unknown first argument \"", args[0], "\""));
  return false;
}